

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O3

void parse_weight_vector(T1_Face face,T1_Loader loader)

{
  undefined8 *puVar1;
  FT_Error FVar2;
  FT_Fixed FVar3;
  long lVar4;
  PS_Blend pPVar5;
  FT_Byte *pFVar6;
  FT_Byte *pFVar7;
  FT_Int num_designs;
  T1_TokenRec design_tokens [16];
  undefined8 uStack_1c8;
  FT_UInt local_1bc;
  T1_TokenRec_ local_1b8 [16];
  
  pPVar5 = face->blend;
  (*(loader->parser).root.funcs.to_token_array)
            ((PS_Parser)loader,local_1b8,0x10,(FT_Int *)&local_1bc);
  if ((int)local_1bc < 0) {
    FVar2 = 0xa2;
    goto LAB_00179361;
  }
  FVar2 = 3;
  if (local_1bc - 0x11 < 0xfffffff0) goto LAB_00179361;
  if ((pPVar5 == (PS_Blend)0x0) || (pPVar5->num_designs == 0)) {
    FVar2 = t1_allocate_blend(face,local_1bc,0);
    if (FVar2 != 0) goto LAB_00179361;
    pFVar7 = (loader->parser).root.cursor;
    pFVar6 = (loader->parser).root.limit;
    if (0 < (int)local_1bc) {
      pPVar5 = face->blend;
      goto LAB_00179312;
    }
  }
  else {
    if (pPVar5->num_designs != local_1bc) goto LAB_00179361;
    pFVar7 = (loader->parser).root.cursor;
    pFVar6 = (loader->parser).root.limit;
LAB_00179312:
    lVar4 = 0;
    puVar1 = &uStack_1c8;
    do {
      (loader->parser).root.cursor = (FT_Byte *)puVar1[2];
      (loader->parser).root.limit = (FT_Byte *)puVar1[3];
      FVar3 = (*(loader->parser).root.funcs.to_fixed)((PS_Parser)loader,0);
      pPVar5->weight_vector[lVar4] = FVar3;
      pPVar5->default_weight_vector[lVar4] = FVar3;
      lVar4 = lVar4 + 1;
      puVar1 = puVar1 + 3;
    } while (lVar4 < (int)local_1bc);
  }
  (loader->parser).root.cursor = pFVar7;
  (loader->parser).root.limit = pFVar6;
  FVar2 = 0;
LAB_00179361:
  (loader->parser).root.error = FVar2;
  return;
}

Assistant:

static void
  parse_weight_vector( T1_Face    face,
                       T1_Loader  loader )
  {
    T1_TokenRec  design_tokens[T1_MAX_MM_DESIGNS];
    FT_Int       num_designs;
    FT_Error     error  = FT_Err_Ok;
    T1_Parser    parser = &loader->parser;
    PS_Blend     blend  = face->blend;
    T1_Token     token;
    FT_Int       n;
    FT_Byte*     old_cursor;
    FT_Byte*     old_limit;


    T1_ToTokenArray( parser, design_tokens,
                     T1_MAX_MM_DESIGNS, &num_designs );
    if ( num_designs < 0 )
    {
      error = FT_ERR( Ignore );
      goto Exit;
    }
    if ( num_designs == 0 || num_designs > T1_MAX_MM_DESIGNS )
    {
      FT_ERROR(( "parse_weight_vector:"
                 " incorrect number of designs: %d\n",
                 num_designs ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    if ( !blend || !blend->num_designs )
    {
      error = t1_allocate_blend( face, (FT_UInt)num_designs, 0 );
      if ( error )
        goto Exit;
      blend = face->blend;
    }
    else if ( blend->num_designs != (FT_UInt)num_designs )
    {
      FT_ERROR(( "parse_weight_vector:"
                 " /BlendDesignPosition and /WeightVector have\n"
                 "                    "
                 " different number of elements\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    old_cursor = parser->root.cursor;
    old_limit  = parser->root.limit;

    for ( n = 0; n < num_designs; n++ )
    {
      token = design_tokens + n;
      parser->root.cursor = token->start;
      parser->root.limit  = token->limit;

      blend->default_weight_vector[n] =
      blend->weight_vector[n]         = T1_ToFixed( parser, 0 );
    }

    parser->root.cursor = old_cursor;
    parser->root.limit  = old_limit;

  Exit:
    parser->root.error = error;
  }